

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallelepiped.cpp
# Opt level: O3

Intersection * __thiscall Parallelepiped::intersects(Parallelepiped *this,Ray *r)

{
  pointer ppTVar1;
  void *pvVar2;
  Intersection *pIVar3;
  Intersection *extraout_RAX;
  ulong uVar4;
  char *pcVar5;
  Intersection *pIVar6;
  
  uVar4 = 0;
  pIVar6 = (Intersection *)0x0;
  do {
    ppTVar1 = (this->triangles).super__Vector_base<Triangle_*,_std::allocator<Triangle_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->triangles).super__Vector_base<Triangle_*,_std::allocator<Triangle_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3) <= uVar4) {
      pcVar5 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar4);
      *(undefined ***)&(((Intersection *)pcVar5)->intersectionPoint).field_0 =
           &PTR__Parallelepiped_0010bd18;
      pvVar2 = *(void **)&((Intersection *)((long)pcVar5 + 0x90))->color;
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,*(long *)((long)&(((Intersection *)((long)pcVar5 + 0xb4))->
                                                intersectionPoint).field_0 + 4) - (long)pvVar2);
        return extraout_RAX;
      }
      return (Intersection *)pcVar5;
    }
    pIVar3 = Triangle::intersects(ppTVar1[uVar4],r);
    if (pIVar3 != (Intersection *)0x0) {
      pIVar6 = pIVar3;
    }
    uVar4 = uVar4 + 1;
  } while (uVar4 != 0xc);
  return pIVar6;
}

Assistant:

Intersection *Parallelepiped::intersects(Ray &r) {
    Intersection *i = NULL, *tmp;
    
    for(int t = 0; t < N_TRIANGLES; ++t) {
        if( tmp = triangles.at(t)->intersects(r) ) {
            i = tmp;
        }
    }
    return i;
}